

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O2

void __thiscall OpenMD::Perturbations::Light::Light(Light *this,SimInfo *info)

{
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier = (_func_int **)&PTR__Light_00284040;
  this->initialized = false;
  this->doLight = false;
  this->doParticlePot = false;
  this->info_ = info;
  Vector<double,_3U>::Vector(&(this->khat_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->k_).super_Vector<double,_3U>);
  (this->jones_).super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->jones_).super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->jones_).super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SquareMatrix<double,_3>::SquareMatrix(&(this->A_).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->Ainv_).super_SquareMatrix<double,_3>);
  this->lightParams = this->info_->simParams_->lightPars_;
  return;
}

Assistant:

Light::Light(SimInfo* info) :
      ForceModifier {info}, initialized {false}, doLight {false},
      doParticlePot {false}, info_(info) {
    lightParams = info_->getSimParams()->getLightParameters();
  }